

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_io.cpp
# Opt level: O0

adios2_error
adios2_inquire_group_variables
          (adios2_variable ***variables,char *full_prefix,size_t *size,adios2_io *io)

{
  DataType DVar1;
  bool bVar2;
  DataType DVar3;
  DataType DVar4;
  ulong uVar5;
  long lVar6;
  size_type sVar7;
  pointer pVVar8;
  Variable *pVVar9;
  string *in_RCX;
  size_t *in_RDX;
  char *in_RSI;
  undefined8 *in_RDI;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar10;
  VariableBase *variable;
  DataType type;
  const_iterator it_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name;
  iterator __end2_1;
  iterator __begin2_1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  size_t n;
  adios2_variable **list;
  size_type pos;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> curr;
  value_type *it;
  const_iterator __end2;
  const_iterator __begin2;
  VarMap *__range2;
  size_t prefix_size;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  VarMap *dataMap;
  IO *ioCpp;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>_>_>
  *in_stack_fffffffffffffe08;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  string *in_stack_fffffffffffffec8;
  adios2_io *in_stack_fffffffffffffed0;
  _Self local_128;
  _Self local_120;
  undefined1 *local_118;
  long local_110;
  void *local_108;
  _Base_ptr local_100;
  undefined1 local_f8;
  ulong local_f0;
  string local_e8 [32];
  reference local_c8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>,_true>
  local_c0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>,_true>
  local_b8;
  undefined8 local_b0;
  size_t local_a8;
  undefined1 local_a0 [48];
  undefined8 local_70;
  string *local_68;
  allocator local_49;
  string local_48 [32];
  string *local_28;
  size_t *local_20;
  char *local_18;
  undefined8 *local_10;
  adios2_error local_4;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_48,"for adios2_io, in call to adios2_inquire_all_variables",&local_49);
  adios2::helper::CheckForNullptr<adios2_io>(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  local_68 = local_28;
  local_70 = adios2::core::IO::GetVariables_abi_cxx11_();
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x1455f7);
  local_a8 = strlen(local_18);
  local_b0 = local_70;
  local_b8._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>_>_>
       ::begin(in_stack_fffffffffffffe08);
  local_c0._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>_>_>
       ::end(in_stack_fffffffffffffe08);
  while (bVar2 = std::__detail::operator!=(&local_b8,&local_c0), bVar2) {
    local_c8 = std::__detail::
               _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>,_false,_true>
               ::operator*((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>,_false,_true>
                            *)0x145671);
    std::__cxx11::string::string(local_e8,(string *)local_c8);
    uVar5 = std::__cxx11::string::size();
    if (((local_a8 < uVar5) &&
        (lVar6 = std::__cxx11::string::find((char *)local_e8,(ulong)local_18), lVar6 == 0)) &&
       (local_f0 = std::__cxx11::string::rfind((char *)local_e8,0x1785ff), local_f0 <= local_a8)) {
      pVar10 = std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                        (value_type *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28))
      ;
      local_100 = (_Base_ptr)pVar10.first._M_node;
      local_f8 = pVar10.second;
    }
    std::__cxx11::string::~string(local_e8);
    std::__detail::
    _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>,_false,_true>
    ::operator++((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>,_false,_true>
                  *)in_stack_fffffffffffffe10);
  }
  sVar7 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x14580a);
  *local_20 = sVar7;
  local_108 = calloc(*local_20,8);
  local_110 = 0;
  local_118 = local_a0;
  local_120._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffe08);
  local_128._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffe08);
  while (bVar2 = std::operator!=(&local_120,&local_128), bVar2) {
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator*((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x1458a6);
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>_>_>
    ::find(in_stack_fffffffffffffe08,(key_type *)0x1458c3);
    std::__detail::
    _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>,_false,_true>
    ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>,_false,_true>
                  *)0x1458e4);
    pVVar8 = std::
             unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>
             ::operator->((unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>
                           *)0x1458f0);
    DVar1 = *(DataType *)(pVVar8 + 0x28);
    if (DVar1 != Struct) {
      DVar3 = adios2::helper::GetDataType<std::__cxx11::string>();
      if (DVar1 == DVar3) {
        pVVar9 = adios2::core::IO::InquireVariable<std::__cxx11::string>(local_68);
        *(Variable **)((long)local_108 + local_110 * 8) = pVVar9;
      }
      else {
        DVar3 = adios2::helper::GetDataType<char>();
        if (DVar1 == DVar3) {
          pVVar9 = adios2::core::IO::InquireVariable<char>(local_68);
          *(Variable **)((long)local_108 + local_110 * 8) = pVVar9;
        }
        else {
          DVar3 = adios2::helper::GetDataType<signed_char>();
          if (DVar1 == DVar3) {
            pVVar9 = adios2::core::IO::InquireVariable<signed_char>(local_68);
            *(Variable **)((long)local_108 + local_110 * 8) = pVVar9;
          }
          else {
            DVar3 = adios2::helper::GetDataType<short>();
            if (DVar1 == DVar3) {
              pVVar9 = adios2::core::IO::InquireVariable<short>(local_68);
              *(Variable **)((long)local_108 + local_110 * 8) = pVVar9;
            }
            else {
              DVar3 = adios2::helper::GetDataType<int>();
              if (DVar1 == DVar3) {
                pVVar9 = adios2::core::IO::InquireVariable<int>(local_68);
                *(Variable **)((long)local_108 + local_110 * 8) = pVVar9;
              }
              else {
                DVar3 = adios2::helper::GetDataType<long>();
                if (DVar1 == DVar3) {
                  pVVar9 = adios2::core::IO::InquireVariable<long>(local_68);
                  *(Variable **)((long)local_108 + local_110 * 8) = pVVar9;
                }
                else {
                  DVar3 = adios2::helper::GetDataType<unsigned_char>();
                  if (DVar1 == DVar3) {
                    pVVar9 = adios2::core::IO::InquireVariable<unsigned_char>(local_68);
                    *(Variable **)((long)local_108 + local_110 * 8) = pVVar9;
                  }
                  else {
                    DVar3 = adios2::helper::GetDataType<unsigned_short>();
                    if (DVar1 == DVar3) {
                      pVVar9 = adios2::core::IO::InquireVariable<unsigned_short>(local_68);
                      *(Variable **)((long)local_108 + local_110 * 8) = pVVar9;
                    }
                    else {
                      DVar3 = adios2::helper::GetDataType<unsigned_int>();
                      if (DVar1 == DVar3) {
                        pVVar9 = adios2::core::IO::InquireVariable<unsigned_int>(local_68);
                        *(Variable **)((long)local_108 + local_110 * 8) = pVVar9;
                      }
                      else {
                        DVar3 = adios2::helper::GetDataType<unsigned_long>();
                        if (DVar1 == DVar3) {
                          pVVar9 = adios2::core::IO::InquireVariable<unsigned_long>(local_68);
                          *(Variable **)((long)local_108 + local_110 * 8) = pVVar9;
                        }
                        else {
                          DVar3 = DVar1;
                          DVar4 = adios2::helper::GetDataType<float>();
                          if (DVar3 == DVar4) {
                            pVVar9 = adios2::core::IO::InquireVariable<float>(local_68);
                            *(Variable **)((long)local_108 + local_110 * 8) = pVVar9;
                          }
                          else {
                            DVar3 = DVar1;
                            DVar4 = adios2::helper::GetDataType<double>();
                            if (DVar3 == DVar4) {
                              pVVar9 = adios2::core::IO::InquireVariable<double>(local_68);
                              *(Variable **)((long)local_108 + local_110 * 8) = pVVar9;
                            }
                            else {
                              DVar3 = DVar1;
                              DVar4 = adios2::helper::GetDataType<long_double>();
                              if (DVar3 == DVar4) {
                                pVVar9 = adios2::core::IO::InquireVariable<long_double>(local_68);
                                *(Variable **)((long)local_108 + local_110 * 8) = pVVar9;
                              }
                              else {
                                DVar3 = DVar1;
                                DVar4 = adios2::helper::GetDataType<std::complex<float>>();
                                if (DVar3 == DVar4) {
                                  pVVar9 = adios2::core::IO::InquireVariable<std::complex<float>>
                                                     (local_68);
                                  *(Variable **)((long)local_108 + local_110 * 8) = pVVar9;
                                }
                                else {
                                  DVar3 = adios2::helper::GetDataType<std::complex<double>>();
                                  if (DVar1 == DVar3) {
                                    pVVar9 = adios2::core::IO::InquireVariable<std::complex<double>>
                                                       (local_68);
                                    *(Variable **)((long)local_108 + local_110 * 8) = pVVar9;
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    local_110 = local_110 + 1;
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(in_stack_fffffffffffffe10);
  }
  *local_10 = local_108;
  local_4 = adios2_error_none;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x145ea4);
  return local_4;
}

Assistant:

adios2_error adios2_inquire_group_variables(adios2_variable ***variables, const char *full_prefix,
                                            size_t *size, adios2_io *io)
{
    try
    {
        adios2::helper::CheckForNullptr(io,
                                        "for adios2_io, in call to adios2_inquire_all_variables");

        adios2::core::IO &ioCpp = *reinterpret_cast<adios2::core::IO *>(io);
        const auto &dataMap = ioCpp.GetVariables();

        // Sort the names so that we return the same order as the
        // C++, python APIs

        std::set<std::string> names;
        size_t prefix_size = strlen(full_prefix);
        for (auto &it : dataMap)
        {
            auto curr = it.first;
            if ((curr.size() > prefix_size) && (0 == curr.find(full_prefix)))
            {
                auto pos = curr.rfind("/");
                if (pos <= prefix_size)
                {
                    names.insert(curr);
                }
            }
        }

        *size = names.size();
        adios2_variable **list = (adios2_variable **)calloc(*size, sizeof(adios2_variable *));

        size_t n = 0;
        for (auto &name : names)
        {
            auto it = dataMap.find(name);
            const adios2::DataType type(it->second->m_Type);
            adios2::core::VariableBase *variable = nullptr;

            if (type == adios2::DataType::Struct)
            {
                // not supported
            }
#define declare_template_instantiation(T)                                                          \
    else if (type == adios2::helper::GetDataType<T>())                                             \
    {                                                                                              \
        variable = ioCpp.InquireVariable<T>(name);                                                 \
        list[n] = reinterpret_cast<adios2_variable *>(variable);                                   \
    }
            ADIOS2_FOREACH_STDTYPE_1ARG(declare_template_instantiation)
#undef declare_template_instantiation

            n++;
        }
        *variables = list;
        return adios2_error_none;
    }
    catch (...)
    {
        return static_cast<adios2_error>(
            adios2::helper::ExceptionToError("adios2_inquire_all_variables"));
    }
}